

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFont::~FFont(FFont *this)

{
  long *plVar1;
  FFont *pFVar2;
  FFont **ppFVar3;
  FFont **ppFVar4;
  CharData *pCVar5;
  ulong uVar6;
  long lVar7;
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_006ff028;
  pCVar5 = this->Chars;
  if (pCVar5 == (CharData *)0x0) goto LAB_00492114;
  if (this->LastChar < this->FirstChar) {
LAB_00492107:
    operator_delete__(pCVar5);
  }
  else {
    uVar6 = (ulong)((this->LastChar - this->FirstChar) + 1);
    lVar7 = 0;
    do {
      plVar1 = *(long **)((long)&this->Chars->Pic + lVar7);
      if ((plVar1 != (long *)0x0) && (*(char *)plVar1[5] == '\0')) {
        (**(code **)(*plVar1 + 8))();
      }
      lVar7 = lVar7 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    pCVar5 = this->Chars;
    if (pCVar5 != (CharData *)0x0) goto LAB_00492107;
  }
  this->Chars = (CharData *)0x0;
LAB_00492114:
  if (this->PatchRemap != (BYTE *)0x0) {
    operator_delete__(this->PatchRemap);
    this->PatchRemap = (BYTE *)0x0;
  }
  if (this->Name != (char *)0x0) {
    operator_delete__(this->Name);
    this->Name = (char *)0x0;
  }
  ppFVar3 = &FirstFont;
  do {
    ppFVar4 = ppFVar3;
    pFVar2 = *ppFVar4;
    if (pFVar2 == (FFont *)0x0) break;
    ppFVar3 = &pFVar2->Next;
  } while (pFVar2 != this);
  if (pFVar2 != (FFont *)0x0) {
    *ppFVar4 = pFVar2->Next;
  }
  TArray<FRemapTable,_FRemapTable>::~TArray(&this->Ranges);
  return;
}

Assistant:

FFont::~FFont ()
{
	if (Chars)
	{
		int count = LastChar - FirstChar + 1;

		for (int i = 0; i < count; ++i)
		{
			if (Chars[i].Pic != NULL && Chars[i].Pic->Name[0] == 0)
			{
				delete Chars[i].Pic;
			}
		}
		delete[] Chars;
		Chars = NULL;
	}
	if (PatchRemap)
	{
		delete[] PatchRemap;
		PatchRemap = NULL;
	}
	if (Name)
	{
		delete[] Name;
		Name = NULL;
	}

	FFont **prev = &FirstFont;
	FFont *font = *prev;

	while (font != NULL && font != this)
	{
		prev = &font->Next;
		font = *prev;
	}

	if (font != NULL)
	{
		*prev = font->Next;
	}
}